

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

bool __thiscall
OpenMesh::PolyConnectivity::is_simply_connected(PolyConnectivity *this,FaceHandle _fh)

{
  size_t *this_00;
  int iVar1;
  _Base_ptr p_Var2;
  value_type vVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  undefined1 local_78 [8];
  set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
  nb_fhs;
  ConstFaceFaceIter cff_it;
  
  nb_fhs._M_t._M_impl._0_4_ = 0;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nb_fhs;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&nb_fhs;
  Iterators::
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
  ::GenericCirculatorT
            ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
              *)&nb_fhs._M_t._M_impl.super__Rb_tree_header._M_node_count,this,
             (FaceHandle)_fh.super_BaseHandle.idx_,false);
  this_00 = &nb_fhs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  do {
    if ((cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ == -1) ||
       (((int)cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
         cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ &&
        (cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
         idx_ != 0)))) {
      bVar5 = true;
LAB_00190cf2:
      std::
      _Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
      ::~_Rb_tree((_Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
                   *)local_78);
      return bVar5;
    }
    vVar3 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                         *)this_00);
    p_Var2 = (_Base_ptr)nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
    p_Var7 = (_Base_ptr)&nb_fhs;
    if (nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      do {
        p_Var6 = p_Var7;
        p_Var4 = p_Var2;
        iVar1 = p_Var4[1]._M_color;
        p_Var7 = p_Var4;
        if (iVar1 < (int)vVar3.super_BaseHandle.idx_) {
          p_Var7 = p_Var6;
        }
        p_Var2 = (&p_Var4->_M_left)[iVar1 < (int)vVar3.super_BaseHandle.idx_];
      } while ((&p_Var4->_M_left)[iVar1 < (int)vVar3.super_BaseHandle.idx_] != (_Base_ptr)0x0);
      if (p_Var7 != (_Base_ptr)&nb_fhs) {
        if (iVar1 < (int)vVar3.super_BaseHandle.idx_) {
          p_Var4 = p_Var6;
        }
        if ((int)p_Var4[1]._M_color <= (int)vVar3.super_BaseHandle.idx_) {
          bVar5 = false;
          goto LAB_00190cf2;
        }
      }
    }
    cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
         Iterators::
         GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
         ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                      *)this_00);
    std::
    _Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
    ::_M_insert_unique<OpenMesh::FaceHandle>
              ((_Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
                *)local_78,
               (FaceHandle *)
               &cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.field_0x14);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                  *)this_00);
  } while( true );
}

Assistant:

bool PolyConnectivity::is_simply_connected(FaceHandle _fh) const
{
  std::set<FaceHandle> nb_fhs;
  for (ConstFaceFaceIter cff_it = cff_iter(_fh); cff_it.is_valid(); ++cff_it)
  {
    if (nb_fhs.find(*cff_it) == nb_fhs.end())
    {
      nb_fhs.insert(*cff_it);
    }
    else
    {//there is more than one link
      return false;
    }
  }
  return true;
}